

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_deserialize_map_element
          (t_perl_generator *this,ostream *out,t_map *tmap,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  string sStack_2a8;
  string val;
  string key;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  t_field fkey;
  t_field fval;
  
  std::__cxx11::string::string((string *)&local_1a8,"key",(allocator *)&fkey);
  t_generator::tmp(&key,(t_generator *)this,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,"val",(allocator *)&fkey);
  t_generator::tmp(&val,(t_generator *)this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  ptVar1 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_1e8,(string *)&key);
  t_field::t_field(&fkey,ptVar1,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  ptVar1 = tmap->val_type_;
  std::__cxx11::string::string((string *)&local_208,(string *)&val);
  t_field::t_field(&fval,ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&sStack_2a8,this,&fkey,true,true);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_2a8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&sStack_2a8,this,&fval,true,true);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_2a8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::string((string *)&local_228,"",(allocator *)&sStack_2a8);
  generate_deserialize_field(this,out,&fkey,&local_228,false);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_248,"",(allocator *)&sStack_2a8);
  generate_deserialize_field(this,out,&fval,&local_248,false);
  std::__cxx11::string::~string((string *)&local_248);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"->{$");
  poVar2 = std::operator<<(poVar2,(string *)&key);
  poVar2 = std::operator<<(poVar2,"} = $");
  poVar2 = std::operator<<(poVar2,(string *)&val);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_field::~t_field(&fval);
  t_field::~t_field(&fkey);
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

void t_perl_generator::generate_deserialize_map_element(ostream& out, t_map* tmap, string prefix) {
  string key = tmp("key");
  string val = tmp("val");
  t_field fkey(tmap->get_key_type(), key);
  t_field fval(tmap->get_val_type(), val);

  indent(out) << declare_field(&fkey, true, true) << endl;
  indent(out) << declare_field(&fval, true, true) << endl;

  generate_deserialize_field(out, &fkey);
  generate_deserialize_field(out, &fval);

  indent(out) << "$" << prefix << "->{$" << key << "} = $" << val << ";" << endl;
}